

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview_p.h
# Opt level: O0

void __thiscall
QTreeViewPrivate::AnimatedOperation::updateCurrentValue(AnimatedOperation *this,QVariant *param_2)

{
  long lVar1;
  AnimatedOperation *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  QRect *rect;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  rect = *(QRect **)(in_RDI + 0x48);
  AnimatedOperation::rect(in_RSI);
  QWidget::update((QWidget *)in_RSI,rect);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void updateCurrentValue(const QVariant &) override { viewport->update(rect()); }